

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_leadingNumbers.cpp
# Opt level: O1

void __thiscall leadingNumbers_powerCascade_Test::TestBody(leadingNumbers_powerCascade_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  double res;
  size_t index;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  AssertHelper local_58;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  double local_30;
  size_t local_28;
  double local_20;
  
  local_28 = 0;
  local_50 = (undefined1  [8])&local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"2^2^2","");
  local_30 = units::detail::testing::testLeadingNumber((string *)local_50,&local_28);
  if (local_50 != (undefined1  [8])&local_40) {
    local_20 = local_30;
    operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
    local_30 = local_20;
  }
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_4030000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_50,"res","16.0",&local_30,(double *)&local_60);
  if (local_50[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x66,pcVar1);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  local_50 = (undefined1  [8])&local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"2^(2^2)","");
  local_30 = units::detail::testing::testLeadingNumber((string *)local_50,&local_28);
  if (local_50 != (undefined1  [8])&local_40) {
    operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
  }
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_4030000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_50,"res","16.0",&local_30,(double *)&local_60);
  if (local_50[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x69,pcVar1);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  local_50 = (undefined1  [8])&local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"3^(2^2)^2","");
  local_30 = units::detail::testing::testLeadingNumber((string *)local_50,&local_28);
  if (local_50 != (undefined1  [8])&local_40) {
    operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
  }
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_418486ba08000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_50,"res","pow(3, 16)",&local_30,(double *)&local_60);
  if (local_50[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x6c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  local_50 = (undefined1  [8])&local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"2^(2)^-2","");
  local_30 = units::detail::testing::testLeadingNumber((string *)local_50,&local_28);
  if (local_50 != (undefined1  [8])&local_40) {
    operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
  }
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3ff306fe0a31b715;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_50,"res","pow(2.0, 0.25)",&local_30,(double *)&local_60);
  if (local_50[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x6f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  return;
}

Assistant:

TEST(leadingNumbers, powerCascade)
{
    size_t index{0U};
    auto res = testLeadingNumber("2^2^2", index);
    EXPECT_EQ(res, 16.0);

    res = testLeadingNumber("2^(2^2)", index);
    EXPECT_EQ(res, 16.0);

    res = testLeadingNumber("3^(2^2)^2", index);
    EXPECT_EQ(res, pow(3, 16));

    res = testLeadingNumber("2^(2)^-2", index);
    EXPECT_EQ(res, pow(2.0, 0.25));
}